

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_dispatch_incoming_commands(ENetHost *host,ENetEvent *event)

{
  ENetPeerState EVar1;
  ENetPeer *peer_00;
  ENetPacket *pEVar2;
  ENetPeer *peer;
  ENetEvent *event_local;
  ENetHost *host_local;
  
  while( true ) {
    if ((host->dispatchQueue).sentinel.next == &(host->dispatchQueue).sentinel) {
      return 0;
    }
    peer_00 = (ENetPeer *)enet_list_remove((host->dispatchQueue).sentinel.next);
    peer_00->needsDispatch = 0;
    EVar1 = peer_00->state;
    if (EVar1 - ENET_PEER_STATE_CONNECTION_PENDING < 2) break;
    if (EVar1 == ENET_PEER_STATE_CONNECTED) {
      if ((peer_00->dispatchedCommands).sentinel.next != &(peer_00->dispatchedCommands).sentinel) {
        pEVar2 = enet_peer_receive(peer_00,&event->channelID);
        event->packet = pEVar2;
        if (event->packet != (ENetPacket *)0x0) {
          event->type = ENET_EVENT_TYPE_RECEIVE;
          event->peer = peer_00;
          if ((peer_00->dispatchedCommands).sentinel.next != &(peer_00->dispatchedCommands).sentinel
             ) {
            peer_00->needsDispatch = 1;
            enet_list_insert(&(host->dispatchQueue).sentinel,peer_00);
          }
          return 1;
        }
      }
    }
    else if (EVar1 == ENET_PEER_STATE_ZOMBIE) {
      host->recalculateBandwidthLimits = 1;
      event->type = ENET_EVENT_TYPE_DISCONNECT;
      event->peer = peer_00;
      event->data = peer_00->eventData;
      enet_peer_reset(peer_00);
      return 1;
    }
  }
  enet_protocol_change_state(host,peer_00,ENET_PEER_STATE_CONNECTED);
  event->type = ENET_EVENT_TYPE_CONNECT;
  event->peer = peer_00;
  event->data = peer_00->eventData;
  return 1;
}

Assistant:

static int enet_protocol_dispatch_incoming_commands(ENetHost* host, ENetEvent* event) {
	while (!enet_list_empty(&host->dispatchQueue)) {
		ENetPeer* peer = (ENetPeer*)enet_list_remove(enet_list_begin(&host->dispatchQueue));
		peer->needsDispatch = 0;

		switch (peer->state) {
		case ENET_PEER_STATE_CONNECTION_PENDING:
		case ENET_PEER_STATE_CONNECTION_SUCCEEDED:
			enet_protocol_change_state(host, peer, ENET_PEER_STATE_CONNECTED);

			event->type = ENET_EVENT_TYPE_CONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			return 1;

		case ENET_PEER_STATE_ZOMBIE:
			host->recalculateBandwidthLimits = 1;
			event->type = ENET_EVENT_TYPE_DISCONNECT;
			event->peer = peer;
			event->data = peer->eventData;

			enet_peer_reset(peer);

			return 1;

		case ENET_PEER_STATE_CONNECTED:
			if (enet_list_empty(&peer->dispatchedCommands))
				continue;

			event->packet = enet_peer_receive(peer, &event->channelID);

			if (event->packet == NULL)
				continue;

			event->type = ENET_EVENT_TYPE_RECEIVE;
			event->peer = peer;

			if (!enet_list_empty(&peer->dispatchedCommands)) {
				peer->needsDispatch = 1;

				enet_list_insert(enet_list_end(&host->dispatchQueue), &peer->dispatchList);
			}

			return 1;

		default:
			break;
		}
	}

	return 0;
}